

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VProd_Serial(N_Vector x,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)*x->content;
  if (0 < lVar4) {
    lVar1 = *(long *)((long)x->content + 8);
    lVar2 = *(long *)((long)y->content + 8);
    lVar3 = *(long *)((long)z->content + 8);
    lVar5 = 0;
    do {
      *(double *)(lVar3 + lVar5 * 8) =
           *(double *)(lVar1 + lVar5 * 8) * *(double *)(lVar2 + lVar5 * 8);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

void N_VProd_Serial(N_Vector x, N_Vector y, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *yd, *zd;

  xd = yd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = xd[i]*yd[i];

  return;
}